

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O0

int run_test_part(char *test,char *part)

{
  int iVar1;
  task_entry_t *ptStack_28;
  int r;
  task_entry_t *task;
  char *part_local;
  char *test_local;
  
  ptStack_28 = TASKS;
  while( true ) {
    if (ptStack_28->main == (_func_int *)0x0) {
      fprintf(_stderr,"No test part with that name: %s:%s\n",test,part);
      fflush(_stderr);
      return 0xff;
    }
    iVar1 = strcmp(test,ptStack_28->task_name);
    if ((iVar1 == 0) && (iVar1 = strcmp(part,ptStack_28->process_name), iVar1 == 0)) break;
    ptStack_28 = ptStack_28 + 1;
  }
  iVar1 = (*ptStack_28->main)();
  return iVar1;
}

Assistant:

int run_test_part(const char* test, const char* part) {
  task_entry_t* task;
  int r;

  for (task = TASKS; task->main; task++) {
    if (strcmp(test, task->task_name) == 0 &&
        strcmp(part, task->process_name) == 0) {
      r = task->main();
      return r;
    }
  }

  fprintf(stderr, "No test part with that name: %s:%s\n", test, part);
  fflush(stderr);
  return 255;
}